

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMakeParser::ParseCtx>::appendInitialize
          (QArrayDataPointer<QMakeParser::ParseCtx> *this,qsizetype newSize)

{
  ParseCtx *pPVar1;
  long in_RSI;
  ParseCtx *in_RDI;
  ParseCtx *e;
  ParseCtx *b;
  
  begin((QArrayDataPointer<QMakeParser::ParseCtx> *)0x319840);
  pPVar1 = begin((QArrayDataPointer<QMakeParser::ParseCtx> *)0x319856);
  std::uninitialized_value_construct<QMakeParser::ParseCtx*>(pPVar1 + in_RSI,in_RDI);
  *(long *)&in_RDI->quote = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }